

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

void js_std_dump_error1(JSContext *ctx,JSValue exception_val)

{
  JSValue val_00;
  JSValue v;
  JSValue this_obj;
  JSValue val_01;
  int iVar1;
  int iVar2;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSContext *in_RDI;
  JSValue JVar3;
  BOOL is_error;
  JSValue val;
  FILE *in_stack_ffffffffffffffb8;
  JSContext *in_stack_ffffffffffffffc0;
  JSValueUnion ctx_00;
  undefined8 in_stack_ffffffffffffffc8;
  int64_t iVar4;
  undefined4 in_stack_ffffffffffffffd0;
  JSContext *in_stack_ffffffffffffffd8;
  JSValueUnion in_stack_ffffffffffffffe0;
  
  val_01.tag = in_RDX;
  val_01.u.float64 = in_RSI.float64;
  iVar1 = JS_IsError(in_RDI,val_01);
  JVar3.tag._0_4_ = in_stack_ffffffffffffffd0;
  JVar3.u = (JSValueUnion)in_stack_ffffffffffffffc8;
  JVar3.tag._4_4_ = iVar1;
  js_dump_obj(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,JVar3);
  if (iVar1 != 0) {
    this_obj.tag = (int64_t)in_RDI;
    this_obj.u.float64 = in_stack_ffffffffffffffe0.float64;
    JVar3 = JS_GetPropertyStr(in_stack_ffffffffffffffd8,this_obj,
                              (char *)CONCAT44(iVar1,in_stack_ffffffffffffffd0));
    ctx_00 = JVar3.u;
    iVar4 = JVar3.tag;
    iVar2 = JS_IsUndefined(JVar3);
    if (iVar2 == 0) {
      val_00.tag._0_4_ = in_stack_ffffffffffffffd0;
      val_00.u.ptr = (void *)iVar4;
      val_00.tag._4_4_ = iVar1;
      js_dump_obj((JSContext *)ctx_00.ptr,in_stack_ffffffffffffffb8,val_00);
    }
    v.tag._0_4_ = in_stack_ffffffffffffffd0;
    v.u.ptr = (void *)iVar4;
    v.tag._4_4_ = iVar1;
    JS_FreeValue((JSContext *)ctx_00.ptr,v);
  }
  return;
}

Assistant:

static void js_std_dump_error1(JSContext *ctx, JSValueConst exception_val)
{
    JSValue val;
    BOOL is_error;
    
    is_error = JS_IsError(ctx, exception_val);
    js_dump_obj(ctx, stderr, exception_val);
    if (is_error) {
        val = JS_GetPropertyStr(ctx, exception_val, "stack");
        if (!JS_IsUndefined(val)) {
            js_dump_obj(ctx, stderr, val);
        }
        JS_FreeValue(ctx, val);
    }
}